

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::setTransitionMatrices
          (BeagleCPUImpl<double,_2,_0> *this,int *matrixIndices,double *inMatrices,
          double *paddedValues,int count)

{
  long in_RCX;
  long in_RSI;
  double *in_RDI;
  int in_R8D;
  int j;
  int i;
  double *offsetBeagleMatrix;
  double *offsetInMatrix;
  int matrixIndex;
  double *inMatrix;
  int k;
  int iVar1;
  int iVar2;
  long local_48;
  int local_28;
  
  for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
    local_48 = *(long *)((long)in_RDI[0x1b] + (long)*(int *)(in_RSI + (long)local_28 * 4) * 8);
    for (iVar2 = 0; iVar2 < *(int *)((long)in_RDI + 0x34); iVar2 = iVar2 + 1) {
      for (iVar1 = 0; iVar1 < *(int *)((long)in_RDI + 0x24); iVar1 = iVar1 + 1) {
        beagleMemCpy<double>((double *)CONCAT44(iVar2,iVar1),in_RDI,0);
        *(undefined8 *)(local_48 + (long)*(int *)((long)in_RDI + 0x24) * 8) =
             *(undefined8 *)(in_RCX + (long)local_28 * 8);
        local_48 = local_48 + (long)*(int *)(in_RDI + 5) * 8;
      }
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTransitionMatrices(const int* matrixIndices,
                                                             const double* inMatrices,
                                                             const double* paddedValues,
                                                             int count) {
    for (int k = 0; k < count; k++) {
        const double* inMatrix = inMatrices + k*kStateCount*kStateCount*kCategoryCount;
        int matrixIndex = matrixIndices[k];

if (T_PAD != 0) {
        const double* offsetInMatrix = inMatrix;
        REALTYPE* offsetBeagleMatrix = gTransitionMatrices[matrixIndex];
        for(int i = 0; i < kCategoryCount; i++) {
            for(int j = 0; j < kStateCount; j++) {
                beagleMemCpy(offsetBeagleMatrix, offsetInMatrix, kStateCount);
                offsetBeagleMatrix[kStateCount] = paddedValues[k];
                offsetBeagleMatrix += kTransPaddedStateCount; // Skip padding
                offsetInMatrix += kStateCount;
            }
        }
} else {
        beagleMemCpy(gTransitionMatrices[matrixIndex], inMatrix,
                     kMatrixSize * kCategoryCount);
}
    }

    return BEAGLE_SUCCESS;
}